

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O0

void IpmiFruBuildBoardInfoArea(EeePModuleInfo_t *info)

{
  SmbiosHandle_t *base;
  char *pcVar1;
  undefined1 *puVar2;
  uint8_t *board_area_ptr;
  char *str;
  void *strstart;
  uint8_t *varp;
  EeePModuleInfo_t *info_local;
  
  board_info_area.area.format_version = '\x01';
  board_info_area.area.language_code = '\x19';
  board_info_area.area.mfg_date_time[0] = '\0';
  board_info_area.area.mfg_date_time[1] = '\0';
  board_info_area.area.mfg_date_time[2] = '\0';
  base = info->Handles + (int)(uint)info->ContainedHndls;
  pcVar1 = GetSmbiosString(info->Manufacturer,base);
  if (pcVar1 == (char *)0x0) {
    strstart = board_info_area.pad;
    board_info_area.area.variable_part[0] = 0xc0;
  }
  else {
    strstart = IpmiFruAddString(board_info_area.area.variable_part,pcVar1);
  }
  pcVar1 = GetSmbiosString(info->Product,base);
  if (pcVar1 == (char *)0x0) {
    *(undefined1 *)strstart = 0xc0;
    strstart = (void *)((long)strstart + 1);
  }
  else {
    strstart = IpmiFruAddString((uint8_t *)strstart,pcVar1);
  }
  pcVar1 = GetSmbiosString(info->SerialNumber,base);
  if (pcVar1 == (char *)0x0) {
    *(undefined1 *)strstart = 0xc0;
    strstart = (void *)((long)strstart + 1);
  }
  else {
    strstart = IpmiFruAddString((uint8_t *)strstart,pcVar1);
  }
  puVar2 = (undefined1 *)((long)strstart + 1);
  *(undefined1 *)strstart = 0xc0;
  strstart = (void *)((long)strstart + 2);
  *puVar2 = 0xc0;
  pcVar1 = GetSmbiosString(info->Version,base);
  if (pcVar1 != (char *)0x0) {
    strstart = IpmiFruAddCustomString((uint8_t *)strstart,"VERSION",pcVar1);
  }
  pcVar1 = GetSmbiosString(info->Location,base);
  if (pcVar1 != (char *)0x0) {
    strstart = IpmiFruAddCustomString((uint8_t *)strstart,"LOCATION",pcVar1);
  }
  pcVar1 = GetSmbiosString(info->AssetTag,base);
  if (pcVar1 != (char *)0x0) {
    strstart = IpmiFruAddCustomString((uint8_t *)strstart,"ASSET_TAG",pcVar1);
  }
  board_info_area_size = IpmiFruFinalizeArea((uint8_t *)&board_info_area,(int)strstart - 0x105970);
  return;
}

Assistant:

void IpmiFruBuildBoardInfoArea(EeePModuleInfo_t *info)
{
    board_info_area.area.format_version = IPMI_FRUINFO_FORMAT_VERSION;
    board_info_area.area.language_code = IPMI_FRUINFO_LANGUAGE_CODE_ENGLISH;
    board_info_area.area.mfg_date_time[0] = 0;
    board_info_area.area.mfg_date_time[1] = 0;
    board_info_area.area.mfg_date_time[2] = 0;
    uint8_t *varp = board_info_area.area.variable_part;

    void *strstart = info->Handles + info->ContainedHndls;
    const char *str;
    //  Manufacturer
    if (str = GetSmbiosString(info->Manufacturer, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Product name
    if (str = GetSmbiosString(info->Product, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Serial number
    if (str = GetSmbiosString(info->SerialNumber, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Part number - not specified
    *varp++ = 0xC0;
    //  FRU File ID - not specified
    *varp++ = 0xC0;
    //  Version as custom string
    if (str = GetSmbiosString(info->Version, strstart)) {
        varp = IpmiFruAddCustomString(varp, "VERSION", str);
    }
    //  Location as custom string
    if (str = GetSmbiosString(info->Location, strstart)) {
        varp = IpmiFruAddCustomString(varp, "LOCATION", str);
    }
    //  Asset tag as custom string
    if (str = GetSmbiosString(info->AssetTag, strstart)) {
        varp = IpmiFruAddCustomString(varp, "ASSET_TAG", str);
    }
    uint8_t *board_area_ptr = (uint8_t *)&board_info_area;
    board_info_area_size = IpmiFruFinalizeArea(board_area_ptr, varp-board_area_ptr);
}